

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O2

Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
* __thiscall
tcu::
Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
::operator=(Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
            *this,Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  *val)

{
  BlendFunc *pBVar1;
  bool bVar2;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar3;
  SeparateBlendFunc *pSVar4;
  BlendFunc BVar5;
  
  pEVar3 = this->m_ptr;
  if (pEVar3 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    pEVar3->m_isFirst = true;
    (pEVar3->field_1).m_first = (BlendFunc *)0x0;
  }
  bVar2 = val->m_isFirst;
  (this->field_1).m_data[0] = bVar2;
  pBVar1 = (BlendFunc *)((long)&this->field_1 + 0x10);
  pSVar4 = (val->field_1).m_second;
  if (bVar2 == true) {
    *pBVar1 = pSVar4->rgb;
  }
  else {
    BVar5 = pSVar4->alpha;
    *pBVar1 = pSVar4->rgb;
    *(BlendFunc *)((long)&this->field_1 + 0x18) = BVar5;
  }
  *(BlendFunc **)((long)&this->field_1 + 8) = pBVar1;
  this->m_ptr = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)&this->field_1;
  return this;
}

Assistant:

Maybe<T>& Maybe<T>::operator= (const T& val)
{
	if (m_ptr)
		m_ptr->~T();

	m_ptr = new(m_data)T(val);

	return *this;
}